

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::compress_pass(crn_comp *this,crn_comp_params *params,float *pEffective_bitrate)

{
  uint uVar1;
  uint uVar2;
  bool local_42;
  bool local_41;
  uint local_38;
  uint local_34;
  uint l;
  uint f;
  uint total_pixels;
  bool status;
  float *pEffective_bitrate_local;
  crn_comp_params *params_local;
  crn_comp *this_local;
  
  clear(this);
  if (pEffective_bitrate != (float *)0x0) {
    *pEffective_bitrate = 0.0;
  }
  this->m_pParams = params;
  local_41 = true;
  if ((((params->m_format != cCRNFmtETC1) && (local_41 = true, params->m_format != cCRNFmtETC2)) &&
      (local_41 = true, params->m_format != cCRNFmtETC2A)) &&
     (local_41 = true, params->m_format != cCRNFmtETC1S)) {
    local_41 = params->m_format == cCRNFmtETC2AS;
  }
  this->m_has_etc_color_blocks = local_41;
  local_42 = true;
  if ((params->m_format != cCRNFmtETC1) && (local_42 = true, params->m_format != cCRNFmtETC2)) {
    local_42 = params->m_format == cCRNFmtETC2A;
  }
  this->m_has_subblocks = local_42;
  uVar1 = math::minimum<unsigned_int>(this->m_pParams->m_width,this->m_pParams->m_height);
  if ((uVar1 == 0) ||
     (uVar1 = math::maximum<unsigned_int>(this->m_pParams->m_width,this->m_pParams->m_height),
     0x1000 < uVar1)) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = task_pool::init(&this->m_task_pool,(EVP_PKEY_CTX *)(ulong)params->m_num_helper_threads);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = compress_internal(this);
      task_pool::deinit(&this->m_task_pool);
      if ((this_local._7_1_) && (pEffective_bitrate != (float *)0x0)) {
        l = 0;
        for (local_34 = 0; local_34 < this->m_pParams->m_faces; local_34 = local_34 + 1) {
          for (local_38 = 0; local_38 < this->m_pParams->m_levels; local_38 = local_38 + 1) {
            uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_total_pixels
                              (this->m_images[local_34] + local_38);
            l = uVar2 + l;
          }
        }
        uVar2 = vector<unsigned_char>::size(&this->m_comp_data);
        *pEffective_bitrate = ((float)uVar2 * 8.0) / (float)l;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool crn_comp::compress_pass(const crn_comp_params& params, float* pEffective_bitrate)
    {
        clear();

        if (pEffective_bitrate)
        {
            *pEffective_bitrate = 0.0f;
        }

        m_pParams = &params;
        m_has_etc_color_blocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A || params.m_format == cCRNFmtETC1S || params.m_format == cCRNFmtETC2AS;
        m_has_subblocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A;

        if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
        {
            return false;
        }

        if (!m_task_pool.init(params.m_num_helper_threads))
        {
            return false;
        }

        bool status = compress_internal();

        m_task_pool.deinit();

        if ((status) && (pEffective_bitrate))
        {
            uint total_pixels = 0;

            for (uint f = 0; f < m_pParams->m_faces; f++)
            {
                for (uint l = 0; l < m_pParams->m_levels; l++)
                {
                    total_pixels += m_images[f][l].get_total_pixels();
                }
            }

            *pEffective_bitrate = (m_comp_data.size() * 8.0f) / total_pixels;
        }

        return status;
    }